

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-from-check.c
# Opt level: O3

int run_test_timer_from_check(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_handle_t uStack_50;
  long local_10;
  
  uStack_50.next_closing = (uv_handle_t *)0x1d22ce;
  puVar2 = uv_default_loop();
  uStack_50.next_closing = (uv_handle_t *)0x1d22dd;
  iVar1 = uv_prepare_init(puVar2,&prepare_handle);
  local_10 = (long)iVar1;
  uStack_50._56_8_ = 0;
  if (local_10 == 0) {
    uStack_50.next_closing = (uv_handle_t *)0x1d2300;
    puVar2 = uv_default_loop();
    uStack_50.next_closing = (uv_handle_t *)0x1d230f;
    iVar1 = uv_check_init(puVar2,&check_handle);
    local_10 = (long)iVar1;
    uStack_50._56_8_ = 0;
    if (local_10 != 0) goto LAB_001d2520;
    uStack_50.next_closing = (uv_handle_t *)0x1d2340;
    iVar1 = uv_check_start(&check_handle,check_cb);
    local_10 = (long)iVar1;
    uStack_50._56_8_ = 0;
    if (local_10 != 0) goto LAB_001d252d;
    uStack_50.next_closing = (uv_handle_t *)0x1d2363;
    puVar2 = uv_default_loop();
    uStack_50.next_closing = (uv_handle_t *)0x1d2372;
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    local_10 = (long)iVar1;
    uStack_50._56_8_ = 0;
    if (local_10 != 0) goto LAB_001d253a;
    uStack_50.next_closing = (uv_handle_t *)0x1d23aa;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    local_10 = (long)iVar1;
    uStack_50._56_8_ = 0;
    if (local_10 != 0) goto LAB_001d2547;
    uStack_50.next_closing = (uv_handle_t *)0x1d23cd;
    puVar2 = uv_default_loop();
    uStack_50.next_closing = (uv_handle_t *)0x1d23d7;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_10 = (long)iVar1;
    uStack_50._56_8_ = 0;
    if (local_10 != 0) goto LAB_001d2554;
    local_10 = 1;
    uStack_50._56_8_ = SEXT48(prepare_cb_called);
    if (uStack_50._56_8_ != 1) goto LAB_001d2561;
    local_10 = 1;
    uStack_50._56_8_ = SEXT48(check_cb_called);
    if (uStack_50._56_8_ != 1) goto LAB_001d256e;
    local_10 = 1;
    uStack_50._56_8_ = SEXT48(timer_cb_called);
    if (uStack_50._56_8_ != 1) goto LAB_001d257b;
    uStack_50.next_closing = (uv_handle_t *)0x1d246c;
    uv_close((uv_handle_t *)&prepare_handle,(uv_close_cb)0x0);
    uStack_50.next_closing = (uv_handle_t *)0x1d247a;
    uv_close((uv_handle_t *)&check_handle,(uv_close_cb)0x0);
    uStack_50.next_closing = (uv_handle_t *)0x1d2488;
    uv_close((uv_handle_t *)&timer_handle,(uv_close_cb)0x0);
    uStack_50.next_closing = (uv_handle_t *)0x1d248d;
    puVar2 = uv_default_loop();
    uStack_50.next_closing = (uv_handle_t *)0x1d249a;
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    local_10 = (long)iVar1;
    uStack_50._56_8_ = 0;
    if (local_10 != 0) goto LAB_001d2588;
    uStack_50.next_closing = (uv_handle_t *)0x1d24bd;
    puVar2 = uv_default_loop();
    uStack_50.next_closing = (uv_handle_t *)0x1d24d1;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uStack_50.next_closing = (uv_handle_t *)0x1d24db;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_10 = 0;
    uStack_50.next_closing = (uv_handle_t *)0x1d24e9;
    puVar2 = uv_default_loop();
    uStack_50.next_closing = (uv_handle_t *)0x1d24f1;
    iVar1 = uv_loop_close(puVar2);
    uStack_50._56_8_ = SEXT48(iVar1);
    if (local_10 == uStack_50._56_8_) {
      uStack_50.next_closing = (uv_handle_t *)0x1d250b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_50.next_closing = (uv_handle_t *)0x1d2520;
    run_test_timer_from_check_cold_1();
LAB_001d2520:
    uStack_50.next_closing = (uv_handle_t *)0x1d252d;
    run_test_timer_from_check_cold_2();
LAB_001d252d:
    uStack_50.next_closing = (uv_handle_t *)0x1d253a;
    run_test_timer_from_check_cold_3();
LAB_001d253a:
    uStack_50.next_closing = (uv_handle_t *)0x1d2547;
    run_test_timer_from_check_cold_4();
LAB_001d2547:
    uStack_50.next_closing = (uv_handle_t *)0x1d2554;
    run_test_timer_from_check_cold_5();
LAB_001d2554:
    uStack_50.next_closing = (uv_handle_t *)0x1d2561;
    run_test_timer_from_check_cold_6();
LAB_001d2561:
    uStack_50.next_closing = (uv_handle_t *)0x1d256e;
    run_test_timer_from_check_cold_7();
LAB_001d256e:
    uStack_50.next_closing = (uv_handle_t *)0x1d257b;
    run_test_timer_from_check_cold_8();
LAB_001d257b:
    uStack_50.next_closing = (uv_handle_t *)0x1d2588;
    run_test_timer_from_check_cold_9();
LAB_001d2588:
    uStack_50.next_closing = (uv_handle_t *)0x1d2595;
    run_test_timer_from_check_cold_10();
  }
  uStack_50.next_closing = (uv_handle_t *)check_cb;
  run_test_timer_from_check_cold_11();
  uStack_50.close_cb = (uv_close_cb)0x1d25b2;
  iVar1 = uv_check_stop(&check_handle);
  uStack_50.next_closing = (uv_handle_t *)(long)iVar1;
  uStack_50.handle_queue.prev = (uv__queue *)0x0;
  if (uStack_50.next_closing == (uv_handle_t *)0x0) {
    uStack_50.close_cb = (uv_close_cb)0x1d25de;
    iVar1 = uv_timer_stop(&timer_handle);
    uStack_50.next_closing = (uv_handle_t *)(long)iVar1;
    uStack_50.handle_queue.prev = (uv__queue *)0x0;
    if (uStack_50.next_closing != (uv_handle_t *)0x0) goto LAB_001d26ee;
    uStack_50.close_cb = (uv_close_cb)0x1d2618;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    uStack_50.next_closing = (uv_handle_t *)(long)iVar1;
    uStack_50.handle_queue.prev = (uv__queue *)0x0;
    if (uStack_50.next_closing != (uv_handle_t *)0x0) goto LAB_001d26fd;
    uStack_50.close_cb = (uv_close_cb)0x1d264b;
    iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
    uStack_50.next_closing = (uv_handle_t *)(long)iVar1;
    uStack_50.handle_queue.prev = (uv__queue *)0x0;
    if (uStack_50.next_closing != (uv_handle_t *)0x0) goto LAB_001d270c;
    uStack_50.next_closing = (uv_handle_t *)(long)prepare_cb_called;
    uStack_50.handle_queue.prev = (uv__queue *)0x0;
    if (uStack_50.next_closing != (uv_handle_t *)0x0) goto LAB_001d271b;
    uStack_50.next_closing = (uv_handle_t *)(long)check_cb_called;
    uStack_50.handle_queue.prev = (uv__queue *)0x0;
    if (uStack_50.next_closing != (uv_handle_t *)0x0) goto LAB_001d272a;
    uStack_50.next_closing = (uv_handle_t *)(long)timer_cb_called;
    uStack_50.handle_queue.prev = (uv__queue *)0x0;
    if (uStack_50.next_closing == (uv_handle_t *)0x0) {
      check_cb_called = check_cb_called + 1;
      return check_cb_called;
    }
  }
  else {
    uStack_50.close_cb = (uv_close_cb)0x1d26ee;
    check_cb_cold_1();
LAB_001d26ee:
    uStack_50.close_cb = (uv_close_cb)0x1d26fd;
    check_cb_cold_2();
LAB_001d26fd:
    uStack_50.close_cb = (uv_close_cb)0x1d270c;
    check_cb_cold_3();
LAB_001d270c:
    uStack_50.close_cb = (uv_close_cb)0x1d271b;
    check_cb_cold_4();
LAB_001d271b:
    uStack_50.close_cb = (uv_close_cb)0x1d272a;
    check_cb_cold_5();
LAB_001d272a:
    uStack_50.close_cb = (uv_close_cb)0x1d2739;
    check_cb_cold_6();
  }
  uStack_50.close_cb = timer_cb;
  check_cb_cold_7();
  uStack_50.data = (void *)0x1d2758;
  iVar1 = uv_timer_stop(&timer_handle);
  uStack_50.close_cb = (uv_close_cb)(long)iVar1;
  uStack_50._16_8_ = 0;
  if (uStack_50.close_cb == (uv_close_cb)0x0) {
    uStack_50.close_cb = (uv_close_cb)0x1;
    uStack_50._16_8_ = SEXT48(prepare_cb_called);
    if (uStack_50._16_8_ != 1) goto LAB_001d27f3;
    uStack_50.close_cb = (uv_close_cb)0x1;
    uStack_50._16_8_ = SEXT48(check_cb_called);
    if (uStack_50._16_8_ != 1) goto LAB_001d2802;
    uStack_50.close_cb = (uv_close_cb)(long)timer_cb_called;
    uStack_50._16_8_ = 0;
    if (uStack_50.close_cb == (uv_close_cb)0x0) {
      timer_cb_called = timer_cb_called + 1;
      return timer_cb_called;
    }
  }
  else {
    uStack_50.data = (void *)0x1d27f3;
    timer_cb_cold_1();
LAB_001d27f3:
    uStack_50.data = (void *)0x1d2802;
    timer_cb_cold_2();
LAB_001d2802:
    uStack_50.data = (void *)0x1d2811;
    timer_cb_cold_3();
  }
  uStack_50.data = prepare_cb;
  timer_cb_cold_4();
  iVar1 = uv_prepare_stop(&prepare_handle);
  uStack_50.data = (void *)(long)iVar1;
  if (uStack_50.data == (void *)0x0) {
    uStack_50.data = (void *)(long)prepare_cb_called;
    if (uStack_50.data != (void *)0x0) goto LAB_001d28cb;
    uStack_50.data = (void *)0x1;
    if (check_cb_called == 1) {
      uStack_50.data = (void *)(long)timer_cb_called;
      if (uStack_50.data == (void *)0x0) {
        prepare_cb_called = prepare_cb_called + 1;
        return prepare_cb_called;
      }
      goto LAB_001d28e9;
    }
  }
  else {
    prepare_cb_cold_1();
LAB_001d28cb:
    prepare_cb_cold_2();
  }
  prepare_cb_cold_3();
LAB_001d28e9:
  handle = &uStack_50;
  prepare_cb_cold_4();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(timer_from_check) {
  ASSERT_OK(uv_prepare_init(uv_default_loop(), &prepare_handle));
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 50, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, prepare_cb_called);
  ASSERT_EQ(1, check_cb_called);
  ASSERT_EQ(1, timer_cb_called);
  uv_close((uv_handle_t*) &prepare_handle, NULL);
  uv_close((uv_handle_t*) &check_handle, NULL);
  uv_close((uv_handle_t*) &timer_handle, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}